

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O0

CodeGenerator * __thiscall CodeGenerator::generate_python_code_abi_cxx11_(CodeGenerator *this)

{
  string local_40 [39];
  undefined1 local_19;
  CodeGenerator *this_local;
  string *code;
  
  local_19 = 0;
  this_local = this;
  std::operator+((char *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "# Generated by program-homework-solver \n\ndef f(x):\n\tanswer = ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

string CodeGenerator::generate_python_code() {
    string code =
            "# Generated by program-homework-solver \n\n"
            "def f(x):\n"
            "\tanswer = " + CodeGenerator::func + "\n"
            "\treturn answer\n"
            "\nfor i in range(0,20):\n"
            "\tprint(f(i))\n";

    return code;
}